

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuArch.c
# Opt level: O2

BoolInt CPU_IsSupported_SHA512(void)

{
  int *piVar1;
  uint *puVar2;
  BoolInt BVar3;
  UInt32 UVar4;
  uint uVar5;
  
  BVar3 = CPU_IsSupported_AVX2();
  uVar5 = 0;
  if ((BVar3 != 0) && (UVar4 = z7_x86_cpuid_GetMaxFunc(), uVar5 = 0, 6 < UVar4)) {
    piVar1 = (int *)cpuid_Extended_Feature_Enumeration_info(7);
    uVar5 = 0;
    if (*piVar1 != 0) {
      puVar2 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
      uVar5 = *puVar2 & 1;
    }
  }
  return uVar5;
}

Assistant:

BoolInt CPU_IsSupported_SHA512(void)
{
  if (!CPU_IsSupported_AVX2()) return False; // maybe CPU_IsSupported_AVX() is enough here

  if (z7_x86_cpuid_GetMaxFunc() < 7)
    return False;
  {
    UInt32 d[4];
    z7_x86_cpuid_subFunc(d, 7, 0);
    if (d[0] < 1) // d[0] - is max supported subleaf value
      return False;
    z7_x86_cpuid_subFunc(d, 7, 1);
    return (BoolInt)(d[0]) & 1;
  }
}